

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

char * parse_value(cJSON *item,char *value)

{
  int iVar1;
  char *value_local;
  cJSON *item_local;
  
  if (value == (char *)0x0) {
    item_local = (cJSON *)0x0;
  }
  else {
    iVar1 = strncmp(value,"null",4);
    if (iVar1 == 0) {
      item->type = 2;
      item_local = (cJSON *)(value + 4);
    }
    else {
      iVar1 = strncmp(value,"false",5);
      if (iVar1 == 0) {
        item->type = 0;
        item_local = (cJSON *)(value + 5);
      }
      else {
        iVar1 = strncmp(value,"true",4);
        if (iVar1 == 0) {
          item->type = 1;
          item->valueint = 1;
          item_local = (cJSON *)(value + 4);
        }
        else if (*value == '\"') {
          item_local = (cJSON *)parse_string(item,value);
        }
        else if ((*value == '-') || (('/' < *value && (*value < ':')))) {
          item_local = (cJSON *)parse_number(item,value);
        }
        else if (*value == '[') {
          item_local = (cJSON *)parse_array(item,value);
        }
        else if (*value == '{') {
          item_local = (cJSON *)parse_object(item,value);
        }
        else {
          item_local = (cJSON *)0x0;
          ep = value;
        }
      }
    }
  }
  return (char *)item_local;
}

Assistant:

static const char *
parse_value(cJSON *item, const char *value)
{
    if (!value)
        return 0; /* Fail on null. */
    if (!strncmp(value, "null", 4)) {
        item->type = cJSON_NULL;
        return value + 4;
    }
    if (!strncmp(value, "false", 5)) {
        item->type = cJSON_False;
        return value + 5;
    }
    if (!strncmp(value, "true", 4)) {
        item->type = cJSON_True;
        item->valueint = 1;
        return value + 4;
    }
    if (*value == '\"') {
        return parse_string(item, value);
    }
    if (*value == '-' || (*value >= '0' && *value <= '9')) {
        return parse_number(item, value);
    }
    if (*value == '[') {
        return parse_array(item, value);
    }
    if (*value == '{') {
        return parse_object(item, value);
    }

    ep = value;
    return 0; /* failure. */
}